

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall CTcSymLocal::write_to_debug_frame(CTcSymLocal *this,int test_only)

{
  int iVar1;
  CTcStreamAnchor *pCVar2;
  CTcCodeStream **__n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int in_ESI;
  CTcDataStream *in_RDI;
  CTcStreamAnchor *anchor;
  int i;
  int flags;
  int inl;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  CTcDataStream *in_stack_ffffffffffffffb0;
  CTcDataStream *this_00;
  CTcCodeStream *ds;
  CTcCodeStream *this_01;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar3;
  undefined1 uVar4;
  int local_20;
  
  if (in_ESI == 0) {
    bVar3 = true;
    if (((char *)0x2 < in_RDI->wp_) && (bVar3 = true, 1 < G_sizes.dbg_fmt_vsn)) {
      iVar1 = CTcGenTarg::is_eval_for_dyn(G_cg);
      bVar3 = iVar1 != 0;
    }
    uVar4 = bVar3;
    if ((*(ushort *)&in_RDI->field_0x64 >> 4 & 1) == 0) {
      __n = &G_cs;
      CTcDataStream::write2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    else {
      __n = &G_cs;
      CTcDataStream::write2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    CTcDataStream::write2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    this_01 = G_cs;
    CTcSymLocalBase::get_ctx_arr_idx
              ((CTcSymLocalBase *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    CTcDataStream::write2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    __buf = extraout_RDX;
    for (local_20 = G_sizes.lcl_hdr + -6; 0 < local_20; local_20 = local_20 + -1) {
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,(size_t)__n);
      __buf = extraout_RDX_00;
    }
    if (bVar3 == false) {
      pCVar2 = CTcDataStream::add_anchor
                         (in_RDI,(CTcSymbol *)CONCAT17(uVar4,in_stack_ffffffffffffffc8),
                          (CTcAbsFixup **)this_01);
      this_00 = (CTcDataStream *)pCVar2->fixup_list_head_;
      ds = G_cs;
      CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      CTcAbsFixup::add_abs_fixup((CTcAbsFixup **)this_01,&ds->super_CTcDataStream,(ulong)this_00);
      CTcDataStream::write4(&this_01->super_CTcDataStream,(ulong)ds);
      CTcDataStream::write2(this_00,in_stack_ffffffffffffffac);
      CTcDataStream::write(G_lcl_stream,(int)in_RDI->obj_file_start_ofs_,in_RDI->wp_,0x4023a0);
    }
    else {
      CTcDataStream::write2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)in_RDI->obj_file_start_ofs_,in_RDI->wp_,0x402388);
    }
  }
  return 1;
}

Assistant:

int CTcSymLocal::write_to_debug_frame(int test_only)
{
    /* if this is test-only mode, just note that we will write it */
    if (test_only)
        return TRUE;

    /* 
     *   For version 2+ static compilation, write the symbol name
     *   out-of-line, to the separate stream for local variable names.  This
     *   allows us to consolidate the names so that each name is stored only
     *   once in the file.  This saves a lot of space since there are a few
     *   common local names that appear over and over.  Version 1 always
     *   wrote names in-line, and we also have to write the names in-line
     *   when generating dynamic code, since we can't add to the constant
     *   pool in this case.
     *   
     *   Also, store all 1- and 2-character names in-line.  1-character names
     *   are smaller if stored in-line since they'll take only three bytes
     *   (two bytes for the length, one byte for the string) vs four bytes
     *   for a shared pool pointer.  2-char names are a wash on the frame
     *   storage, but it's still more efficient to store them in-line because
     *   we avoid also creating the constant pool entry for them.  
     */
    int inl = (len_ <= 2
               || G_sizes.dbg_fmt_vsn < 2
               || G_cg->is_eval_for_dyn());
    
    /* 
     *   write my ID - if we're a context variable, we want to write the
     *   context variable ID; otherwise write our stack location as normal 
     */
    if (is_ctx_local_)
        G_cs->write2(ctx_var_num_);
    else
        G_cs->write2(var_num_);

    /* compute my flags */
    int flags = 0;
    if (is_param_)
        flags |= 0x0001;
    if (is_ctx_local_)
        flags |= 0x0002;
    if (!inl)
        flags |= 0x0004;

    /* write my flags */
    G_cs->write2(flags);

    /* write my local context array index */
    G_cs->write2(get_ctx_arr_idx());

    /* add zeros to pad any future version information for the target VM */
    for (int i = G_sizes.lcl_hdr - 6 ; i > 0 ; --i)
        G_cs->write(0);

    /* 
     *   write the name - either to the separate stream for local names, or
     *   inline if necessary 
     */
    if (inl)
    {
        /* write the symbol name to the table in-line */
        G_cs->write2(len_);
        G_cs->write(str_, len_);
    }
    else
    {
        /* add a fixup from the table to the local stream */
        CTcStreamAnchor *anchor = G_lcl_stream->add_anchor(0, 0);
        CTcAbsFixup::add_abs_fixup(anchor->fixup_list_head_,
                                   G_cs, G_cs->get_ofs());

        /* add the placeholder to the table (this is what we fix up) */
        G_cs->write4(0);

        /* write the name to the local stream */
        G_lcl_stream->write2(len_);
        G_lcl_stream->write(str_, len_);
    }

    /* we did write this symbol */
    return TRUE;
}